

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_frame.cc
# Opt level: O3

pair<bool,_std::unique_ptr<pstack::Dwarf::FDE,_std::default_delete<pstack::Dwarf::FDE>_>_>
__thiscall pstack::Dwarf::CFI::putFDEorCIE(CFI *this,DWARFReader *reader)

{
  element_type *peVar1;
  CFI **ppCVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  _func_int *endOff_;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  FDE *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  DWARFReader *in_RDX;
  FDE *extraout_RDX;
  _Head_base<0UL,_pstack::Dwarf::FDE_*,_false> _Var5;
  __uniq_ptr_data<pstack::Dwarf::FDE,_std::default_delete<pstack::Dwarf::FDE>,_true,_true>
  extraout_RDX_00;
  bool bVar6;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_long,_pstack::Dwarf::CIE>_>,_bool> pVar7;
  pair<bool,_std::unique_ptr<pstack::Dwarf::FDE,_std::default_delete<pstack::Dwarf::FDE>_>_> pVar8;
  _func_int *local_98;
  _Head_base<0UL,_unsigned_long_&,_false> local_90;
  CFI *local_88;
  tuple<const_pstack::Dwarf::CFI_*&&,_pstack::Dwarf::DWARFReader_&,_unsigned_long_&> local_80;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  undefined4 local_60;
  char local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  Info *local_48;
  Off associatedCIE;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  peVar1 = (element_type *)in_RDX->off;
  endOff_ = (_func_int *)
            decodeCIEFDEHdr((CFI *)reader,in_RDX,(FIType)reader[1].off,
                            (Off *)&stack0xffffffffffffffb8);
  associatedCIE = (Off)this;
  if (endOff_ == (_func_int *)0x0) {
    *(undefined1 *)
     &(this->io).super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr = 0;
    _Var5._M_head_impl = extraout_RDX;
  }
  else {
    if (local_48 != (Info *)0xffffffffffffffff) {
      p_Var3 = reader[1].io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      if (p_Var3 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
LAB_00137af2:
        ppCVar2 = (CFI **)reader->off;
        local_38 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)reader->end;
        if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            local_38->_M_use_count = local_38->_M_use_count + 1;
            UNLOCK();
          }
          else {
            local_38->_M_use_count = local_38->_M_use_count + 1;
          }
        }
        local_80.
        super__Tuple_impl<0UL,_const_pstack::Dwarf::CFI_*&&,_pstack::Dwarf::DWARFReader_&,_unsigned_long_&>
        .super__Tuple_impl<1UL,_pstack::Dwarf::DWARFReader_&,_unsigned_long_&>.
        super__Tuple_impl<2UL,_unsigned_long_&>.super__Head_base<2UL,_unsigned_long_&,_false>.
        _M_head_impl = (_Head_base<2UL,_unsigned_long_&,_false>)
                       (_Head_base<2UL,_unsigned_long_&,_false>)local_48;
        local_80.
        super__Tuple_impl<0UL,_const_pstack::Dwarf::CFI_*&&,_pstack::Dwarf::DWARFReader_&,_unsigned_long_&>
        .super__Tuple_impl<1UL,_pstack::Dwarf::DWARFReader_&,_unsigned_long_&>.
        super__Head_base<1UL,_pstack::Dwarf::DWARFReader_&,_false>._M_head_impl =
             (DWARFReader *)
             (*(code *)((*ppCVar2)->cies)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)
                       (ppCVar2);
        local_68 = local_38;
        local_60 = 8;
        local_80.
        super__Tuple_impl<0UL,_const_pstack::Dwarf::CFI_*&&,_pstack::Dwarf::DWARFReader_&,_unsigned_long_&>
        .super__Head_base<0UL,_const_pstack::Dwarf::CFI_*&&,_false>._M_head_impl = ppCVar2;
        putFDEorCIE((CFI *)&stack0xffffffffffffffa8,reader);
        if ((local_58 != '\x01') ||
           (local_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
          __assert_fail("success && notAnFde == nullptr",
                        "/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/dwarf_frame.cc"
                        ,0x7a,
                        "std::pair<bool, std::unique_ptr<FDE>> pstack::Dwarf::CFI::putFDEorCIE(DWARFReader &) const"
                       );
        }
        if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
        }
      }
      else {
        p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&reader[1].io;
        do {
          bVar6 = (Info *)p_Var3[2]._vptr__Sp_counted_base < local_48;
          if (!bVar6) {
            p_Var4 = p_Var3;
          }
          p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   (&p_Var3[1]._vptr__Sp_counted_base)[bVar6];
        } while (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0);
        if ((p_Var4 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&reader[1].io) ||
           (local_48 < (Info *)p_Var4[2]._vptr__Sp_counted_base)) goto LAB_00137af2;
      }
      this_00 = (FDE *)operator_new(0x40);
      FDE::FDE(this_00,(CFI *)reader,in_RDX,(Off)local_48,(Off)endOff_);
      if ((_func_int *)in_RDX->end < endOff_) {
LAB_00137c27:
        __assert_fail("end >= off_",
                      "/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/libpstack/dwarf.h"
                      ,0x3b2,"void pstack::Dwarf::DWARFReader::setOffset(Elf::Off)");
      }
      in_RDX->off = (Off)endOff_;
      *(undefined1 *)associatedCIE = 1;
      *(FDE **)(associatedCIE + 8) = this_00;
      _Var5._M_head_impl =
           (FDE *)extraout_RDX_00.
                  super___uniq_ptr_impl<pstack::Dwarf::FDE,_std::default_delete<pstack::Dwarf::FDE>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_pstack::Dwarf::FDE_*,_std::default_delete<pstack::Dwarf::FDE>_>
                  .super__Head_base<0UL,_pstack::Dwarf::FDE_*,_false>._M_head_impl;
      goto LAB_00137c15;
    }
    local_90._M_head_impl = (unsigned_long *)&stack0xffffffffffffffa8;
    local_80.
    super__Tuple_impl<0UL,_const_pstack::Dwarf::CFI_*&&,_pstack::Dwarf::DWARFReader_&,_unsigned_long_&>
    .super__Tuple_impl<1UL,_pstack::Dwarf::DWARFReader_&,_unsigned_long_&>.
    super__Tuple_impl<2UL,_unsigned_long_&>.super__Head_base<2UL,_unsigned_long_&,_false>.
    _M_head_impl = (_Head_base<2UL,_unsigned_long_&,_false>)&local_98;
    local_80.
    super__Tuple_impl<0UL,_const_pstack::Dwarf::CFI_*&&,_pstack::Dwarf::DWARFReader_&,_unsigned_long_&>
    .super__Head_base<0UL,_const_pstack::Dwarf::CFI_*&&,_false>._M_head_impl = &local_88;
    local_98 = endOff_;
    local_88 = (CFI *)reader;
    local_80.
    super__Tuple_impl<0UL,_const_pstack::Dwarf::CFI_*&&,_pstack::Dwarf::DWARFReader_&,_unsigned_long_&>
    .super__Tuple_impl<1UL,_pstack::Dwarf::DWARFReader_&,_unsigned_long_&>.
    super__Head_base<1UL,_pstack::Dwarf::DWARFReader_&,_false>._M_head_impl = in_RDX;
    _local_58 = peVar1;
    pVar7 = std::
            _Rb_tree<unsigned_long,std::pair<unsigned_long_const,pstack::Dwarf::CIE>,std::_Select1st<std::pair<unsigned_long_const,pstack::Dwarf::CIE>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,pstack::Dwarf::CIE>>>
            ::
            _M_emplace_unique<std::piecewise_construct_t_const&,std::tuple<unsigned_long&>,std::tuple<pstack::Dwarf::CFI_const*&&,pstack::Dwarf::DWARFReader&,unsigned_long&>>
                      ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,pstack::Dwarf::CIE>,std::_Select1st<std::pair<unsigned_long_const,pstack::Dwarf::CIE>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,pstack::Dwarf::CIE>>>
                        *)&reader[1].end,(piecewise_construct_t *)&std::piecewise_construct,
                       (tuple<unsigned_long_&> *)&local_90,&local_80);
    _Var5._M_head_impl = pVar7._8_8_;
    if ((_func_int *)in_RDX->end < endOff_) goto LAB_00137c27;
    in_RDX->off = (Off)endOff_;
    *(undefined1 *)associatedCIE = 1;
  }
  (((CFI *)associatedCIE)->io).super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
LAB_00137c15:
  pVar8.second._M_t.
  super___uniq_ptr_impl<pstack::Dwarf::FDE,_std::default_delete<pstack::Dwarf::FDE>_>._M_t.
  super__Tuple_impl<0UL,_pstack::Dwarf::FDE_*,_std::default_delete<pstack::Dwarf::FDE>_>.
  super__Head_base<0UL,_pstack::Dwarf::FDE_*,_false>._M_head_impl =
       (__uniq_ptr_data<pstack::Dwarf::FDE,_std::default_delete<pstack::Dwarf::FDE>,_true,_true>)
       (__uniq_ptr_data<pstack::Dwarf::FDE,_std::default_delete<pstack::Dwarf::FDE>,_true,_true>)
       _Var5._M_head_impl;
  pVar8._0_8_ = associatedCIE;
  return pVar8;
}

Assistant:

std::pair<bool, std::unique_ptr<FDE>>
CFI::putFDEorCIE( DWARFReader &reader ) const {
   size_t startOffset = reader.getOffset();
   Elf::Off associatedCIE;
   Elf::Off nextoff = decodeCIEFDEHdr(reader, type, &associatedCIE);
   if (nextoff == 0)
      return { false, nullptr };
   if (associatedCIE == Elf::Off(-1)) {
      putCIE(startOffset, reader, nextoff);
      reader.setOffset( nextoff );
      return { true, nullptr };
   } else {
      if (cies.find(associatedCIE) == cies.end()) {
         DWARFReader r2( io, associatedCIE );
         auto [ success, notAnFde ] = putFDEorCIE(r2);
         assert(success && notAnFde == nullptr);
      }
      std::unique_ptr<FDE> fde = std::make_unique<FDE>(*this, reader, associatedCIE, nextoff);
      reader.setOffset( nextoff );
      return {true, std::move(fde) };
   }
}